

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GrpLineAndFile.hpp
# Opt level: O2

string * __thiscall
GrpLineAndFile::FileWithPath(string *__return_storage_ptr__,GrpLineAndFile *this,string *staPath)

{
  char cVar1;
  char *pcVar2;
  pointer pcVar3;
  bool bVar4;
  size_t ich;
  ulong uVar5;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  bVar4 = std::operator==(&this->m_staFile,"");
  if (((bVar4) || (pcVar2 = (this->m_staFile)._M_dataplus._M_p, *pcVar2 == '/')) ||
     (pcVar2[1] == ':')) {
    std::__cxx11::string::_M_assign((string *)__return_storage_ptr__);
  }
  else {
    std::__cxx11::string::_M_assign((string *)__return_storage_ptr__);
    std::__cxx11::string::append((string *)__return_storage_ptr__);
  }
  for (uVar5 = 0; uVar5 < __return_storage_ptr__->_M_string_length; uVar5 = uVar5 + 1) {
    pcVar3 = (__return_storage_ptr__->_M_dataplus)._M_p;
    cVar1 = pcVar3[uVar5];
    if ((cVar1 == '\\') || (cVar1 == '/')) {
      pcVar3[uVar5] = '/';
    }
  }
  return __return_storage_ptr__;
}

Assistant:

std::string FileWithPath(std::string staPath) // append the given path unless the file has an absolute path
	{
		std::string staResult;
		if (m_staFile == "")
			staResult = m_staFile;
		else if (m_staFile[0] == '/' || m_staFile[1] == ':') //  / is Linux, C: is Windows
		{
			// Absolute path
			staResult = m_staFile;
		}
		else
		{
			// Relative path
			staResult = staPath;
			staResult.append(m_staFile);
		}

		// Make all the slashes consistent.
#ifdef _WIN32
		char chSlash = '\\';
#else
		char chSlash = '/';
#endif // _WIN32
		for (size_t ich = 0; ich < staResult.length(); ich++)
		{
			if (staResult[ich] == '\\' || staResult[ich] == '/')
				staResult[ich] = chSlash;
		}

		return staResult;
	}